

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O3

string * __thiscall
s2textformat::ToString_abi_cxx11_
          (string *__return_storage_ptr__,s2textformat *this,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *points)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  AppendVertices(*(S2Point **)this,
                 (int)((ulong)(*(long *)(this + 8) - (long)*(S2Point **)this) >> 3) * -0x55555555,
                 __return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string ToString(const vector<S2Point>& points) {
  string out;
  AppendVertices(points.data(), points.size(), &out);
  return out;
}